

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluDefs.cpp
# Opt level: O0

void __thiscall eglu::Error::Error(Error *this,deUint32 errCode,char *errStr)

{
  char *pcVar1;
  char *local_a0;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  char *local_20;
  char *errStr_local;
  Error *pEStack_10;
  deUint32 errCode_local;
  Error *this_local;
  
  local_20 = errStr;
  errStr_local._4_4_ = errCode;
  pEStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"EGL returned ",&local_61);
  pcVar1 = getErrorName(errStr_local._4_4_);
  std::operator+(&local_40,&local_60,pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  if (local_20 == (char *)0x0) {
    local_a0 = "";
  }
  else {
    local_a0 = local_20;
  }
  tcu::TestError::TestError
            ((TestError *)this,pcVar1,local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluDefs.cpp"
             ,0x38);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  *(undefined ***)this = &PTR__Error_0326a3d0;
  this->m_error = errStr_local._4_4_;
  return;
}

Assistant:

Error::Error (deUint32 errCode, const char* errStr)
	: tcu::TestError	((std::string("EGL returned ") + getErrorName(errCode)).c_str(), errStr ? errStr : "", __FILE__, __LINE__)
	, m_error			(errCode)
{
}